

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVIMaker.cpp
# Opt level: O2

void __thiscall AVIMaker::addFrame(AVIMaker *this,size_t stream_id,TRIPLERGB **frame)

{
  TRIPLERGB **local_8;
  
  local_8 = frame;
  std::vector<TRIPLERGB_**,_std::allocator<TRIPLERGB_**>_>::push_back
            (&(this->videoStreams).super__Vector_base<VideoStream_*,_std::allocator<VideoStream_*>_>
              ._M_impl.super__Vector_impl_data._M_start[stream_id]->frames,&local_8);
  return;
}

Assistant:

void AVIMaker::addFrame(size_t stream_id, TRIPLERGB **frame) {
    VideoStream *videoStream = this->videoStreams[stream_id];
    videoStream->frames.push_back(frame);
}